

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O2

Result wabt::ApplyNames(Module *module)

{
  ExprVisitor *this;
  Var *var;
  pointer ppFVar1;
  Func *this_00;
  pointer ppGVar2;
  pointer ppEVar3;
  Event *pEVar4;
  pointer ppEVar5;
  Export *pEVar6;
  pointer ppEVar7;
  ElemSegment *pEVar8;
  pointer pEVar9;
  pointer ppDVar10;
  DataSegment *pDVar11;
  pointer ppVVar12;
  Result RVar13;
  Index IVar14;
  Memory *pMVar15;
  Var *var_00;
  Enum EVar16;
  size_t i;
  ulong uVar17;
  pointer pEVar18;
  Var *pVVar19;
  size_t i_4;
  string_view name;
  NameApplier applier;
  
  this = &applier.visitor_;
  applier.super_DelegateNop.super_Delegate._vptr_Delegate = (Delegate)&PTR__NameApplier_001befb0;
  applier.module_ = (Module *)0x0;
  applier.current_func_ = (Func *)0x0;
  ExprVisitor::ExprVisitor(this,(Delegate *)&applier);
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  applier.labels_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  applier.param_and_local_index_to_name_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  applier.module_ = module;
  for (uVar17 = 0;
      ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(module->funcs).
                             super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar17 = uVar17 + 1) {
    this_00 = ppFVar1[uVar17];
    applier.current_func_ = this_00;
    if (((this_00->decl).has_func_type == true) &&
       (RVar13 = anon_unknown_11::NameApplier::UseNameForFuncTypeVar
                           (&applier,&(this_00->decl).type_var), RVar13.enum_ == Error))
    goto LAB_0015403d;
    IVar14 = Func::GetNumParamsAndLocals(this_00);
    MakeTypeBindingReverseMapping
              ((ulong)IVar14,&this_00->bindings,&applier.param_and_local_index_to_name_);
    RVar13 = ExprVisitor::VisitFunc(this,this_00);
    if (RVar13.enum_ == Error) goto LAB_0015403d;
    applier.current_func_ = (Func *)0x0;
  }
  uVar17 = 0;
  do {
    ppGVar2 = (module->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->globals).
                      super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppGVar2 >> 3) <= uVar17) {
      uVar17 = 0;
      goto LAB_00154061;
    }
    RVar13 = ExprVisitor::VisitExprList(this,&ppGVar2[uVar17]->init_expr);
    uVar17 = uVar17 + 1;
  } while (RVar13.enum_ != Error);
  goto LAB_0015403d;
LAB_00154061:
  ppEVar3 = (module->events).super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(module->events).
                    super__Vector_base<wabt::Event_*,_std::allocator<wabt::Event_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3) <= uVar17)
  goto LAB_00154095;
  pEVar4 = ppEVar3[uVar17];
  if (((pEVar4->decl).has_func_type == true) &&
     (RVar13 = anon_unknown_11::NameApplier::UseNameForFuncTypeVar
                         (&applier,&(pEVar4->decl).type_var), RVar13.enum_ == Error))
  goto LAB_0015403d;
  uVar17 = uVar17 + 1;
  goto LAB_00154061;
LAB_00154095:
  for (uVar17 = 0;
      ppEVar5 = (module->exports).
                super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(module->exports).
                             super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar5 >> 3);
      uVar17 = uVar17 + 1) {
    pEVar6 = ppEVar5[uVar17];
    if (pEVar6->kind == First) {
      anon_unknown_11::NameApplier::UseNameForFuncVar(&applier,&pEVar6->var);
    }
  }
  for (uVar17 = 0;
      ppEVar7 = (module->elem_segments).
                super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar17 < (ulong)((long)(module->elem_segments).
                             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar7 >> 3);
      uVar17 = uVar17 + 1) {
    pEVar8 = ppEVar7[uVar17];
    RVar13 = anon_unknown_11::NameApplier::UseNameForTableVar(&applier,&pEVar8->table_var);
    if ((RVar13.enum_ == Error) ||
       (RVar13 = ExprVisitor::VisitExprList(this,&pEVar8->offset), RVar13.enum_ == Error))
    goto LAB_0015403d;
    pEVar9 = *(pointer *)
              ((long)&(pEVar8->elem_exprs).
                      super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl +
              8);
    for (pEVar18 = (pEVar8->elem_exprs).
                   super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>._M_impl.
                   super__Vector_impl_data._M_start; pEVar18 != pEVar9; pEVar18 = pEVar18 + 1) {
      if ((pEVar18->kind == RefFunc) &&
         (RVar13 = anon_unknown_11::NameApplier::UseNameForFuncVar(&applier,&pEVar18->var),
         RVar13.enum_ == Error)) goto LAB_0015403d;
    }
  }
  pVVar19 = (Var *)0x0;
  do {
    ppDVar10 = (module->data_segments).
               super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    var_00 = (Var *)((long)(module->data_segments).
                           super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar10 >> 3);
    if (var_00 <= pVVar19) {
      uVar17 = 0;
      goto LAB_001541c0;
    }
    pDVar11 = ppDVar10[(long)pVVar19];
    var = &pDVar11->memory_var;
    pMVar15 = Module::GetMemory(applier.module_,var);
    if (pMVar15 == (Memory *)0x0) break;
    name.size_ = (size_type)var;
    name.data_ = (char *)(pMVar15->name)._M_string_length;
    anon_unknown_11::NameApplier::UseNameForVar
              ((NameApplier *)(pMVar15->name)._M_dataplus._M_p,name,var_00);
    RVar13 = ExprVisitor::VisitExprList(this,&pDVar11->offset);
    pVVar19 = (Var *)((long)&(pVVar19->loc).filename.data_ + 1);
  } while (RVar13.enum_ != Error);
  goto LAB_0015403d;
  while( true ) {
    RVar13 = anon_unknown_11::NameApplier::UseNameForFuncVar(&applier,ppVVar12[uVar17]);
    uVar17 = uVar17 + 1;
    if (RVar13.enum_ == Error) break;
LAB_001541c0:
    ppVVar12 = (module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(module->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12 >> 3) <= uVar17) {
      applier.module_ = (Module *)0x0;
      EVar16 = Ok;
      goto LAB_00154040;
    }
  }
LAB_0015403d:
  EVar16 = Error;
LAB_00154040:
  anon_unknown_11::NameApplier::~NameApplier(&applier);
  return (Result)EVar16;
}

Assistant:

Result ApplyNames(Module* module) {
  NameApplier applier;
  return applier.VisitModule(module);
}